

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O3

void GetStatistics(ZopfliLZ77Store *store,SymbolStats *stats)

{
  ushort uVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  size_t *psVar7;
  
  if (store->size != 0) {
    puVar2 = store->litlens;
    puVar3 = store->dists;
    uVar5 = 0;
    do {
      uVar1 = puVar3[uVar5];
      if (uVar1 == 0) {
        psVar7 = stats->litlens + puVar2[uVar5];
      }
      else {
        stats->litlens[*(int *)(ZopfliGetLengthSymbol_table + (ulong)puVar2[uVar5] * 4)] =
             stats->litlens[*(int *)(ZopfliGetLengthSymbol_table + (ulong)puVar2[uVar5] * 4)] + 1;
        uVar6 = uVar1 - 1;
        if (4 < uVar1) {
          uVar4 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar6 = (uint)((uVar6 >> ((byte)(0x1e - (char)(uVar4 ^ 0x1f)) & 0x1f) & 1) != 0) +
                  (uVar4 ^ 0x1f) * 2 ^ 0x3e;
        }
        psVar7 = stats->dists + uVar6;
      }
      *psVar7 = *psVar7 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < store->size);
  }
  stats->litlens[0x100] = 1;
  ZopfliCalculateEntropy(stats->litlens,0x120,stats->ll_symbols);
  ZopfliCalculateEntropy(stats->dists,0x20,stats->d_symbols);
  return;
}

Assistant:

static void GetStatistics(const ZopfliLZ77Store* store, SymbolStats* stats) {
  size_t i;
  for (i = 0; i < store->size; i++) {
    if (store->dists[i] == 0) {
      stats->litlens[store->litlens[i]]++;
    } else {
      stats->litlens[ZopfliGetLengthSymbol(store->litlens[i])]++;
      stats->dists[ZopfliGetDistSymbol(store->dists[i])]++;
    }
  }
  stats->litlens[256] = 1;  /* End symbol. */

  CalculateStatistics(stats);
}